

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int coda_inflateResetKeep(z_streamp strm)

{
  internal_state *piVar1;
  int iVar2;
  internal_state *piVar3;
  inflate_state *state;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    *(undefined8 *)(piVar1 + 0x28) = 0;
    strm->total_out = 0;
    strm->total_in = 0;
    strm->msg = (char *)0x0;
    if (*(int *)(piVar1 + 0x10) != 0) {
      strm->adler = (long)(int)(*(uint *)(piVar1 + 0x10) & 1);
    }
    *(undefined4 *)(piVar1 + 8) = 0x3f34;
    *(undefined4 *)(piVar1 + 0xc) = 0;
    *(undefined4 *)(piVar1 + 0x14) = 0;
    *(undefined4 *)(piVar1 + 0x18) = 0xffffffff;
    *(undefined4 *)(piVar1 + 0x1c) = 0x8000;
    *(undefined8 *)(piVar1 + 0x30) = 0;
    *(undefined8 *)(piVar1 + 0x50) = 0;
    *(undefined4 *)(piVar1 + 0x58) = 0;
    piVar3 = piVar1 + 0x558;
    *(internal_state **)(piVar1 + 0x90) = piVar3;
    *(internal_state **)(piVar1 + 0x70) = piVar3;
    *(internal_state **)(piVar1 + 0x68) = piVar3;
    *(undefined4 *)(piVar1 + 0x1be8) = 1;
    *(undefined4 *)(piVar1 + 0x1bec) = 0xffffffff;
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateResetKeep(z_streamp strm) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = Z_NULL;
    if (state->wrap)        /* to support ill-conceived Java test suite */
        strm->adler = state->wrap & 1;
    state->mode = HEAD;
    state->last = 0;
    state->havedict = 0;
    state->flags = -1;
    state->dmax = 32768U;
    state->head = Z_NULL;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    state->sane = 1;
    state->back = -1;
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}